

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_order.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalOrder::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalOrder *this)

{
  int iVar1;
  reference this_00;
  pointer pLVar2;
  vector<duckdb::ColumnBinding,_true> local_28;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(this->super_LogicalOperator).children,0);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(this_00);
  (*pLVar2->_vptr_LogicalOperator[2])(&local_28,pLVar2);
  iVar1 = (*(this->super_LogicalOperator)._vptr_LogicalOperator[0xc])(this);
  if ((char)iVar1 == '\0') {
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    LogicalOperator::MapBindings(__return_storage_ptr__,&local_28,&this->projection_map);
    if (local_28.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalOrder::GetColumnBindings() {
	auto child_bindings = children[0]->GetColumnBindings();
	if (!HasProjectionMap()) {
		return child_bindings;
	}
	return MapBindings(child_bindings, projection_map);
}